

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::Read<tcu::Vector<int,4>>
          (BasicAllFormatsLoadStoreComputeStage *this,GLenum internalformat,Vector<int,_4> *value,
          Vector<int,_4> *expected_value)

{
  bool bVar1;
  GLuint shader;
  GLenum GVar2;
  GLenum GVar3;
  GLint GVar4;
  reference pvVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  string local_130;
  Vector<int,_4> local_110;
  string local_100;
  Vector<int,_4> local_e0;
  string local_d0;
  int local_b0;
  undefined1 local_ac [4];
  int i;
  vec4 zero;
  GLuint texture [2];
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> data;
  int kSize;
  GLchar *pGStack_60;
  GLuint sh;
  char *src;
  string source;
  GLuint program;
  Vector<int,_4> *expected_value_local;
  Vector<int,_4> *value_local;
  GLenum internalformat_local;
  BasicAllFormatsLoadStoreComputeStage *this_local;
  
  GenCS<tcu::Vector<int,4>>((string *)&src,this,internalformat);
  pGStack_60 = (GLchar *)std::__cxx11::string::c_str();
  shader = glu::CallLogWrapper::glCreateShader((CallLogWrapper *)(this + 8),0x91b9);
  glu::CallLogWrapper::glShaderSource
            ((CallLogWrapper *)(this + 8),shader,1,&stack0xffffffffffffffa0,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader((CallLogWrapper *)(this + 8),shader);
  source.field_2._12_4_ = glu::CallLogWrapper::glCreateProgram((CallLogWrapper *)(this + 8));
  glu::CallLogWrapper::glAttachShader((CallLogWrapper *)(this + 8),source.field_2._12_4_,shader);
  glu::CallLogWrapper::glLinkProgram((CallLogWrapper *)(this + 8),source.field_2._12_4_);
  glu::CallLogWrapper::glDeleteShader((CallLogWrapper *)(this + 8),shader);
  std::allocator<tcu::Vector<int,_4>_>::allocator
            ((allocator<tcu::Vector<int,_4>_> *)((long)texture + 3));
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)(texture + 1),1,
             value,(allocator<tcu::Vector<int,_4>_> *)((long)texture + 3));
  std::allocator<tcu::Vector<int,_4>_>::~allocator
            ((allocator<tcu::Vector<int,_4>_> *)((long)texture + 3));
  glu::CallLogWrapper::glGenTextures((CallLogWrapper *)(this + 8),2,(GLuint *)(zero.m_data + 2));
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0xde1,(GLuint)zero.m_data[2]);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0xde1,0x2800,0x2600);
  GVar2 = ShaderImageLoadStoreBase::Format<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
  GVar3 = ShaderImageLoadStoreBase::Type<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
  pvVar5 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                     ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                      (texture + 1),0);
  glu::CallLogWrapper::glTexImage2D
            ((CallLogWrapper *)(this + 8),0xde1,0,internalformat,1,1,0,GVar2,GVar3,pvVar5);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0xde1,(GLuint)zero.m_data[3]);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0xde1,0x2800,0x2600);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_ac,0.0);
  GVar2 = ShaderImageLoadStoreBase::Format<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
  GVar3 = ShaderImageLoadStoreBase::Type<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
  glu::CallLogWrapper::glTexImage2D
            ((CallLogWrapper *)(this + 8),0xde1,0,internalformat,1,1,0,GVar2,GVar3,local_ac);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0xde1,0);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),source.field_2._12_4_);
  GVar4 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),source.field_2._12_4_,"g_image_read");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar4,0);
  GVar4 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),source.field_2._12_4_,"g_image_write");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar4,1);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),0,(GLuint)zero.m_data[2],0,'\x01',0,35000,internalformat);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),1,(GLuint)zero.m_data[3],0,'\x01',0,0x88b9,internalformat)
  ;
  glu::CallLogWrapper::glDispatchCompute((CallLogWrapper *)(this + 8),1,1,1);
  local_b0 = 0;
  do {
    if (1 < local_b0) {
      glu::CallLogWrapper::glDeleteTextures
                ((CallLogWrapper *)(this + 8),2,(GLuint *)(zero.m_data + 2));
      glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),0);
      glu::CallLogWrapper::glDeleteProgram((CallLogWrapper *)(this + 8),source.field_2._12_4_);
      this_local._7_1_ = true;
LAB_01045cf7:
      std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~vector
                ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)(texture + 1)
                );
      std::__cxx11::string::~string((string *)&src);
      return this_local._7_1_;
    }
    glu::CallLogWrapper::glBindTexture
              ((CallLogWrapper *)(this + 8),0xde1,(GLuint)zero.m_data[(long)local_b0 + 2]);
    glu::CallLogWrapper::glMemoryBarrier((CallLogWrapper *)(this + 8),0x100);
    GVar2 = ShaderImageLoadStoreBase::Format<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
    GVar3 = ShaderImageLoadStoreBase::Type<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
    pvVar5 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                       ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                        (texture + 1),0);
    glu::CallLogWrapper::glGetTexImage((CallLogWrapper *)(this + 8),0xde1,0,GVar2,GVar3,pvVar5);
    pvVar5 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                       ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                        (texture + 1),0);
    bVar1 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::Equal
                      ((ShaderImageLoadStoreBase *)this,pvVar5,expected_value,internalformat);
    if (!bVar1) {
      glu::CallLogWrapper::glDeleteTextures
                ((CallLogWrapper *)(this + 8),4,(GLuint *)(zero.m_data + 2));
      glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),0);
      glu::CallLogWrapper::glDeleteProgram((CallLogWrapper *)(this + 8),source.field_2._12_4_);
      pvVar5 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                         ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                          (texture + 1),0);
      tcu::Vector<int,_4>::Vector(&local_e0,pvVar5);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>
                (&local_d0,(ShaderImageLoadStoreBase *)this,&local_e0);
      uVar6 = std::__cxx11::string::c_str();
      tcu::Vector<int,_4>::Vector(&local_110,expected_value);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>
                (&local_100,(ShaderImageLoadStoreBase *)this,&local_110);
      uVar7 = std::__cxx11::string::c_str();
      ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                (&local_130,(ShaderImageLoadStoreBase *)this,internalformat);
      uVar8 = std::__cxx11::string::c_str();
      gl4cts::anon_unknown_0::Output
                ("Value is: %s. Value should be: %s. Format is: %s.\n",uVar6,uVar7,uVar8);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_d0);
      this_local._7_1_ = false;
      goto LAB_01045cf7;
    }
    local_b0 = local_b0 + 1;
  } while( true );
}

Assistant:

bool Read(GLenum internalformat, const T& value, const T& expected_value)
	{
		GLuint			  program;
		std::string		  source = GenCS<T>(internalformat);
		const char* const src	= source.c_str();
		GLuint			  sh	 = glCreateShader(GL_COMPUTE_SHADER);
		glShaderSource(sh, 1, &src, NULL);
		glCompileShader(sh);
		program = glCreateProgram();
		glAttachShader(program, sh);
		glLinkProgram(program);
		glDeleteShader(sh);

		const int	  kSize = 1;
		std::vector<T> data(kSize * kSize, value);
		GLuint		   texture[2];
		glGenTextures(2, texture);

		glBindTexture(GL_TEXTURE_2D, texture[0]);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_2D, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_2D, texture[1]);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		vec4 zero(0);
		glTexImage2D(GL_TEXTURE_2D, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(), &zero);

		glBindTexture(GL_TEXTURE_2D, 0);

		glUseProgram(program);
		glUniform1i(glGetUniformLocation(program, "g_image_read"), 0);
		glUniform1i(glGetUniformLocation(program, "g_image_write"), 1);

		glBindImageTexture(0, texture[0], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(1, texture[1], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);

		glDispatchCompute(1, 1, 1);

		for (int i = 0; i < 2; ++i)
		{
			glBindTexture(GL_TEXTURE_2D, texture[i]);
			glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
			glGetTexImage(GL_TEXTURE_2D, 0, Format<T>(), Type<T>(), &data[0]);

			if (!Equal(data[0], expected_value, internalformat))
			{
				glDeleteTextures(4, texture);
				glUseProgram(0);
				glDeleteProgram(program);
				Output("Value is: %s. Value should be: %s. Format is: %s.\n", ToString(data[0]).c_str(),
					   ToString(expected_value).c_str(), FormatEnumToString(internalformat).c_str());
				return false;
			}
		}
		glDeleteTextures(2, texture);
		glUseProgram(0);
		glDeleteProgram(program);
		return true;
	}